

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
          (QMovableArrayOps<QItemSelectionRange> *this,qsizetype i,QItemSelectionRange *args)

{
  qsizetype *pqVar1;
  QItemSelectionRange **ppQVar2;
  Data *pDVar3;
  QItemSelectionRange *pQVar4;
  long lVar5;
  QPersistentModelIndexData *pQVar6;
  QPersistentModelIndex QVar7;
  QPersistentModelIndex QVar8;
  qsizetype qVar9;
  long in_FS_OFFSET;
  bool bVar10;
  Inserter IStack_68;
  QItemSelectionRange local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QItemSelectionRange>).
           super_QArrayDataPointer<QItemSelectionRange>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QItemSelectionRange>).
        super_QArrayDataPointer<QItemSelectionRange>.size == i) {
      qVar9 = QArrayDataPointer<QItemSelectionRange>::freeSpaceAtEnd
                        ((QArrayDataPointer<QItemSelectionRange> *)this);
      if (qVar9 != 0) {
        pQVar4 = (this->super_QGenericArrayOps<QItemSelectionRange>).
                 super_QArrayDataPointer<QItemSelectionRange>.ptr;
        lVar5 = (this->super_QGenericArrayOps<QItemSelectionRange>).
                super_QArrayDataPointer<QItemSelectionRange>.size;
        pQVar6 = (args->tl).d;
        (args->tl).d = (QPersistentModelIndexData *)0x0;
        pQVar4[lVar5].tl.d = pQVar6;
        pQVar6 = (args->br).d;
        (args->br).d = (QPersistentModelIndexData *)0x0;
        pQVar4[lVar5].br.d = pQVar6;
        (this->super_QGenericArrayOps<QItemSelectionRange>).
        super_QArrayDataPointer<QItemSelectionRange>.size = lVar5 + 1;
        goto LAB_00409af2;
      }
    }
    if (i == 0) {
      qVar9 = QArrayDataPointer<QItemSelectionRange>::freeSpaceAtBegin
                        ((QArrayDataPointer<QItemSelectionRange> *)this);
      if (qVar9 != 0) {
        pQVar4 = (this->super_QGenericArrayOps<QItemSelectionRange>).
                 super_QArrayDataPointer<QItemSelectionRange>.ptr;
        pQVar6 = (args->tl).d;
        (args->tl).d = (QPersistentModelIndexData *)0x0;
        pQVar4[-1].tl.d = pQVar6;
        pQVar6 = (args->br).d;
        (args->br).d = (QPersistentModelIndexData *)0x0;
        pQVar4[-1].br.d = pQVar6;
        ppQVar2 = &(this->super_QGenericArrayOps<QItemSelectionRange>).
                   super_QArrayDataPointer<QItemSelectionRange>.ptr;
        *ppQVar2 = *ppQVar2 + -1;
        pqVar1 = &(this->super_QGenericArrayOps<QItemSelectionRange>).
                  super_QArrayDataPointer<QItemSelectionRange>.size;
        *pqVar1 = *pqVar1 + 1;
        goto LAB_00409af2;
      }
    }
  }
  pQVar6 = (args->tl).d;
  (args->tl).d = (QPersistentModelIndexData *)0x0;
  local_40.br.d = (args->br).d;
  (args->br).d = (QPersistentModelIndexData *)0x0;
  bVar10 = (this->super_QGenericArrayOps<QItemSelectionRange>).
           super_QArrayDataPointer<QItemSelectionRange>.size != 0;
  local_40.tl.d = pQVar6;
  QArrayDataPointer<QItemSelectionRange>::detachAndGrow
            ((QArrayDataPointer<QItemSelectionRange> *)this,(uint)(i == 0 && bVar10),1,
             (QItemSelectionRange **)0x0,(QArrayDataPointer<QItemSelectionRange> *)0x0);
  QVar7.d = local_40.br.d;
  if (i == 0 && bVar10) {
    pQVar4 = (this->super_QGenericArrayOps<QItemSelectionRange>).
             super_QArrayDataPointer<QItemSelectionRange>.ptr;
    local_40.tl.d = (QPersistentModelIndexData *)0x0;
    pQVar4[-1].tl.d = pQVar6;
    local_40.br.d = (QPersistentModelIndexData *)0x0;
    pQVar4[-1].br.d = QVar7.d;
    (this->super_QGenericArrayOps<QItemSelectionRange>).super_QArrayDataPointer<QItemSelectionRange>
    .ptr = pQVar4 + -1;
    pqVar1 = &(this->super_QGenericArrayOps<QItemSelectionRange>).
              super_QArrayDataPointer<QItemSelectionRange>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  else {
    Inserter::Inserter(&IStack_68,(QArrayDataPointer<QItemSelectionRange> *)this,i,1);
    QVar8.d = local_40.br.d;
    QVar7.d = local_40.tl.d;
    local_40.tl.d = (QPersistentModelIndexData *)0x0;
    ((IStack_68.displaceFrom)->tl).d = QVar7.d;
    local_40.br.d = (QPersistentModelIndexData *)0x0;
    ((IStack_68.displaceFrom)->br).d = QVar8.d;
    IStack_68.displaceFrom = IStack_68.displaceFrom + 1;
    Inserter::~Inserter(&IStack_68);
  }
  QItemSelectionRange::~QItemSelectionRange(&local_40);
LAB_00409af2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }